

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeletal_mesh.h
# Opt level: O0

bool __thiscall
SkeletalMesh::Scene::getSkeletonTransform
          (Scene *this,SkeletonTransf *transf,SkeletonModifier *modifier)

{
  aiNode *node;
  aiMatrix4x4 parentTransf;
  bool bVar1;
  size_type __new_size;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [8];
  aiMatrix4x4 invTransf;
  aiMatrix4x4 identityMtrx;
  SkeletonModifier *modifier_local;
  SkeletonTransf *transf_local;
  Scene *this_local;
  
  if ((this->available & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    __new_size = std::vector<SkeletalMesh::Bone,_std::allocator<SkeletalMesh::Bone>_>::size
                           (&this->skeleton);
    std::
    vector<glm::mat<4,_4,_float,_(glm::qualifier)0>,_std::allocator<glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>
    ::resize(transf,__new_size);
    aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&invTransf.d3);
    memcpy(local_a8,&this->scene->mRootNode->mTransformation,0x40);
    aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_a8);
    node = this->scene->mRootNode;
    memcpy(&local_e8,&invTransf.d3,0x40);
    parentTransf.a3 = (float)(undefined4)uStack_e0;
    parentTransf.a4 = (float)uStack_e0._4_4_;
    parentTransf.a1 = (float)(undefined4)local_e8;
    parentTransf.a2 = (float)local_e8._4_4_;
    parentTransf.b1 = (float)(undefined4)local_d8;
    parentTransf.b2 = (float)local_d8._4_4_;
    parentTransf.b3 = (float)(undefined4)uStack_d0;
    parentTransf.b4 = (float)uStack_d0._4_4_;
    parentTransf.c1 = (float)(undefined4)local_c8;
    parentTransf.c2 = (float)local_c8._4_4_;
    parentTransf.c3 = (float)(undefined4)uStack_c0;
    parentTransf.c4 = (float)uStack_c0._4_4_;
    parentTransf.d1 = (float)(undefined4)local_b8;
    parentTransf.d2 = (float)local_b8._4_4_;
    parentTransf.d3 = (float)(undefined4)uStack_b0;
    parentTransf.d4 = (float)uStack_b0._4_4_;
    recursivelyGetTransf(this,transf,modifier,node,parentTransf,(aiMatrix4x4 *)local_a8);
    bVar1 = std::
            vector<glm::mat<4,_4,_float,_(glm::qualifier)0>,_std::allocator<glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>
            ::empty(transf);
    this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool getSkeletonTransform(SkeletonTransf &transf, SkeletonModifier &modifier) const {
            if (!available) return false;

            transf.resize(skeleton.size());

            aiMatrix4x4 identityMtrx, invTransf = scene->mRootNode->mTransformation;
            invTransf.Inverse();
            recursivelyGetTransf(transf, modifier, scene->mRootNode, identityMtrx, invTransf);
            return !transf.empty();
        }